

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall
CVmObjStringBuffer::to_utf8(CVmObjStringBuffer *this,char *buf,int32_t *idx,int32_t *bytelen)

{
  wchar_t ch;
  int *piVar1;
  size_t sVar2;
  int iVar3;
  vm_strbuf_ext *ext;
  int iVar4;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  iVar4 = *idx;
  if (iVar4 < 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *piVar1;
    if (iVar4 <= *piVar1) goto LAB_00271331;
  }
  iVar4 = iVar3;
  *idx = iVar4;
LAB_00271331:
  iVar3 = 0;
  while ((iVar3 < *bytelen && (iVar4 < *piVar1))) {
    ch = piVar1[(long)iVar4 + 3];
    iVar4 = 3 - (uint)((uint)ch < 0x800);
    if (ch < L'\x80') {
      iVar4 = 1;
    }
    if (*bytelen - iVar3 < iVar4) break;
    sVar2 = utf8_ptr::s_putch(buf,ch);
    buf = buf + sVar2;
    iVar3 = iVar3 + iVar4;
    iVar4 = *idx + 1;
    *idx = iVar4;
  }
  *bytelen = iVar3;
  return;
}

Assistant:

void CVmObjStringBuffer::to_utf8(char *buf, int32_t &idx, int32_t &bytelen)
{
    vm_strbuf_ext *ext = get_ext();

    /* keep the index within our limits */
    adjust_args(&idx, 0, 0);

    /* we haven't copied any bytes yet */
    int32_t actual = 0;

    /* set up a utf8 pointer for the output buffer */
    utf8_ptr dst(buf);

    /* 
     *   copy characters until we reach the end of the string, or exhaust the
     *   requested number of bytes 
     */
    for (actual = 0 ; actual < bytelen && idx < (int32_t)ext->len ; ++idx)
    {
        /* get the next source character */
        wchar_t c = ext->buf[idx];
        int clen = utf8_ptr::s_wchar_size(c);
        
        /* make sure it fits in the remaining output buffer space */
        if (clen > bytelen - actual)
            break;

        /* store the character */
        dst.setch(c);

        /* count it in the output size */
        actual += clen;
    }

    /* return the actual length copied in bytelen */
    bytelen = actual;
}